

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptBigInt.cpp
# Opt level: O0

digit_t Js::JavascriptBigInt::MulDigit(digit_t a,digit_t b,digit_t *resultHigh)

{
  digit_t dVar1;
  digit_t resultLow;
  digit_t carry;
  digit_t rHigh;
  digit_t rMid2;
  digit_t rMid1;
  digit_t rLow;
  digit_t bHigh;
  digit_t bLow;
  digit_t aHigh;
  digit_t aLow;
  digit_t kHalfDigitMask;
  digit_t kHalfDigitBits;
  digit_t *resultHigh_local;
  digit_t b_local;
  digit_t a_local;
  
  kHalfDigitMask = 0x20;
  aLow = 0xffffffff;
  aHigh = a & 0xffffffff;
  bLow = a >> 0x20;
  bHigh = b & 0xffffffff;
  rLow = b >> 0x20;
  rMid1 = aHigh * bHigh;
  rMid2 = aHigh * rLow;
  rHigh = bLow * bHigh;
  carry = bLow * rLow;
  resultLow = 0;
  kHalfDigitBits = (digit_t)resultHigh;
  resultHigh_local = (digit_t *)b;
  b_local = a;
  dVar1 = AddDigit(rMid1,rMid2 << 0x20,&resultLow);
  dVar1 = AddDigit(dVar1,rHigh << ((byte)kHalfDigitMask & 0x3f),&resultLow);
  *(digit_t *)kHalfDigitBits =
       (rMid2 >> ((byte)kHalfDigitMask & 0x3f)) + (rHigh >> ((byte)kHalfDigitMask & 0x3f)) + carry +
       resultLow;
  return dVar1;
}

Assistant:

digit_t JavascriptBigInt::MulDigit(digit_t a, digit_t b, digit_t* resultHigh)
    {
        // Multiply is performed in half chuck favor.
        // For inputs [AH AL]*[BH BL], the result is:
        //
        //            [AL*BL]  // rLow
        //    +    [AL*BH]     // rMid1
        //    +    [AH*BL]     // rMid2
        //    + [AH*BH]        // rHigh
        //    = [R1 R2 R3 R4]  // high = [R1 R2], low = [R3 R4]
        //

        digit_t kHalfDigitBits = sizeof(digit_t) * 4;
        digit_t kHalfDigitMask = ((digit_t)1 << kHalfDigitBits) - 1;

        digit_t aLow = a & kHalfDigitMask;
        digit_t aHigh = a >> kHalfDigitBits;
        digit_t bLow = b & kHalfDigitMask;
        digit_t bHigh = b >> kHalfDigitBits;

        digit_t rLow = aLow * bLow;
        digit_t rMid1 = aLow * bHigh;
        digit_t rMid2 = aHigh * bLow;
        digit_t rHigh = aHigh * bHigh;

        digit_t carry = 0;
        digit_t resultLow = JavascriptBigInt::AddDigit(rLow, rMid1 << kHalfDigitBits, &carry);
        resultLow = JavascriptBigInt::AddDigit(resultLow, rMid2 << kHalfDigitBits, &carry);
        *resultHigh = (rMid1 >> kHalfDigitBits) + (rMid2 >> kHalfDigitBits) + rHigh + carry;
        return resultLow;
    }